

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clistats.cpp
# Opt level: O2

double __thiscall DynamicHistogram<double>::order(DynamicHistogram<double> *this,int kth)

{
  size_type __n;
  double dVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  runtime_error *this_00;
  size_type __n_00;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double local_70;
  vector<double,_std::allocator<double>_> dist;
  
  iVar2 = (*this->_vptr_DynamicHistogram[2])();
  if ((char)iVar2 == '\0') {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"DynamicHistogram::order - Histogram could not be initialized.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_70 = bin(this,0);
  dVar5 = total(this);
  dVar5 = (double)kth / dVar5;
  if (dVar5 <= 0.0) {
    dVar5 = 0.0;
  }
  if (1.0 <= dVar5) {
    dVar5 = 1.0;
  }
  cdf(&dist,this);
  iVar3 = (int)((ulong)((long)dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                       (long)dist.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start) >> 3);
  iVar2 = 1;
  if (1 < iVar3) {
    iVar2 = iVar3;
  }
  __n = 0;
  do {
    __n_00 = __n;
    if (iVar2 - 1 == __n_00) goto LAB_00189b98;
    __n = __n_00 + 1;
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(&dist,__n);
  } while ((((*pvVar4 == 0.0) && (!NAN(*pvVar4))) ||
           (pvVar4 = std::vector<double,_std::allocator<double>_>::at(&dist,__n_00), dVar5 < *pvVar4
           )) || (pvVar4 = std::vector<double,_std::allocator<double>_>::at(&dist,__n),
                 *pvVar4 < dVar5));
  pvVar4 = std::vector<double,_std::allocator<double>_>::at(&dist,__n);
  dVar6 = *pvVar4;
  pvVar4 = std::vector<double,_std::allocator<double>_>::at(&dist,__n_00);
  iVar2 = (int)__n_00;
  if ((dVar6 != *pvVar4) || (NAN(dVar6) || NAN(*pvVar4))) {
    dVar7 = bin(this,(int)__n);
    dVar8 = bin(this,iVar2);
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(&dist,__n);
    dVar6 = *pvVar4;
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(&dist,__n_00);
    dVar1 = *pvVar4;
    local_70 = bin(this,iVar2);
    pvVar4 = std::vector<double,_std::allocator<double>_>::at(&dist,__n_00);
    local_70 = (dVar5 - *pvVar4) * ((dVar7 - dVar8) / (dVar6 - dVar1)) + local_70;
  }
  else {
    local_70 = bin(this,iVar2);
    dVar5 = bin(this,(int)__n);
    dVar6 = bin(this,iVar2);
    local_70 = (dVar5 - dVar6) * 0.5 + local_70;
  }
LAB_00189b98:
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&dist.super__Vector_base<double,_std::allocator<double>_>);
  return local_70;
}

Assistant:

double
    order(int kth)
    {
        if (!this->merge()) throw std::runtime_error("DynamicHistogram::order - Histogram could not be initialized.");

        // Estimate of the k'th order statistic
        double estimate = this->bin(0);

        // Compute order's probability and clip at [0,1]
        double numItems = this->total();
        double probability = (double) (kth) / numItems;
        probability = std::max<double>(0, probability);
        probability = std::min<double>(1, probability);

        // Look up probability in cdf
        std::vector<double> dist = this->cdf();
        int numBins = dist.size();
        for (int i = 0; i < numBins-1; i++)
        {
            if (dist.at(i+1) == 0) continue;
            if ((dist.at(i) <= probability) && (probability <= dist.at(i+1)))
            {
                if (dist.at(i+1) == dist.at(i))
                {
                    // If flat cdf avoid divide-by-zero
                    estimate = this->bin(i) + 0.5 * (this->bin(i+1) - this->bin(i));
                }
                else
                {
                    // Linearly interpolate between enclosing bins
                    double slope = (this->bin(i+1) - this->bin(i)) / (dist.at(i+1) - dist.at(i));
                    estimate = this->bin(i) + slope * (probability - dist.at(i));
                }
                return estimate;
            }
        }

        return estimate;

    }